

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O0

int os_file_names_equal(char *a,char *b)

{
  int iVar1;
  size_t sVar2;
  size_t *p;
  size_t *ele_len;
  char *in_RSI;
  char *in_RDI;
  size_t lenb;
  size_t lena;
  char *pb;
  char *pa;
  size_t local_38;
  size_t local_30;
  char *start;
  
  sVar2 = strlen(in_RDI);
  p = (size_t *)(in_RDI + sVar2);
  start = in_RSI;
  sVar2 = strlen(in_RSI);
  ele_len = (size_t *)(in_RSI + sVar2);
  do {
    p = (size_t *)prev_path_ele(start,(char *)p,ele_len);
    ele_len = (size_t *)prev_path_ele(start,(char *)p,ele_len);
    if ((p == (size_t *)0x0) || (ele_len == (size_t *)0x0)) {
      return (uint)(p == ele_len);
    }
  } while ((local_30 == local_38) && (iVar1 = memcmp(p,ele_len,local_30), iVar1 == 0));
  return 0;
}

Assistant:

int os_file_names_equal(const char *a, const char *b)
{
    /* start at the end of each name and work backwards */
    const char *pa = a + strlen(a), *pb = b + strlen(b);

    /* keep going until we reach the start of one or the other path */
    for (;;)
    {
        size_t lena, lenb;

        /* get the next earlier element of each path */
        pa = prev_path_ele(a, pa, &lena);
        pb = prev_path_ele(b, pb, &lenb);

        /* if one or the other ran out, we're done */
        if (pa == 0 || pb == 0)
        {
            /* the paths match if they ran out at the same time */
            return pa == pb;
        }

        /* if the two elements don't match, return unequal */
        if (lena != lenb || fname_memcmp(pa, pb, lena) != 0)
            return FALSE;
    }
}